

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp.c
# Opt level: O1

void on_bytes_received(void *context,uchar *buffer,size_t len)

{
  uchar uVar1;
  byte bVar2;
  __int32_t *p_Var3;
  int iVar4;
  HTTP_HEADERS_RESULT HVar5;
  uint uVar6;
  HTTP_HEADERS_HANDLE pHVar7;
  LOGGER_LOG p_Var8;
  BUFFER_HANDLE pBVar9;
  uchar *puVar10;
  size_t sVar11;
  long lVar12;
  char *value;
  __int32_t **pp_Var13;
  bool bVar14;
  undefined4 uVar15;
  size_t sVar16;
  uchar *puVar17;
  int iVar18;
  ulong uVar19;
  undefined7 uVar20;
  int iVar21;
  HTTP_CLIENT_HANDLE_DATA *http_data;
  char *pcVar22;
  char *pcVar23;
  uchar *puVar24;
  ulong uVar25;
  uchar *puVar26;
  size_t index;
  uchar *puVar27;
  uchar *puVar28;
  size_t sVar29;
  bool bVar30;
  size_t count;
  char *header;
  char *in_stack_ffffffffffffff58;
  int local_74;
  undefined8 local_68;
  size_t local_60;
  ulong local_58;
  uchar *local_50;
  uint local_44;
  char *local_40;
  HTTP_HEADERS_HANDLE local_38;
  
  if (len == 0 || (buffer == (uchar *)0x0 || context == (void *)0x0)) {
    return;
  }
  if (*(int *)((long)context + 0x4c) == 0xb) {
    return;
  }
  if (*(int *)((long)context + 0x4c) == 8) {
    setup_init_recv_msg((HTTP_RECV_DATA *)((long)context + 0x38));
  }
  if ((*(uint *)((long)context + 0x4c) & 0xfffffffd) == 0) {
    iVar4 = 0;
    bVar30 = true;
    if (*(long *)((long)context + 0x50) == 0) {
      pHVar7 = HTTPHeaders_Alloc();
      *(HTTP_HEADERS_HANDLE *)((long)context + 0x50) = pHVar7;
      if (pHVar7 == (HTTP_HEADERS_HANDLE)0x0) {
        p_Var8 = xlogging_get_log_function();
        iVar4 = 0x76;
        if (p_Var8 == (LOGGER_LOG)0x0) {
          bVar30 = false;
        }
        else {
          bVar30 = false;
          (*p_Var8)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                    ,"initialize_received_data",0x75,1,"Failure creating Http header.");
        }
      }
    }
    if (bVar30) {
      iVar4 = 0;
      if (*(long *)((long)context + 0x68) == 0) {
        pBVar9 = BUFFER_new();
        *(BUFFER_HANDLE *)((long)context + 0x68) = pBVar9;
        iVar4 = 0;
        if (pBVar9 == (BUFFER_HANDLE)0x0) {
          p_Var8 = xlogging_get_log_function();
          iVar4 = 0x80;
          if (p_Var8 != (LOGGER_LOG)0x0) {
            (*p_Var8)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                      ,"initialize_received_data",0x7f,1,"Failure creating accrual buffer.");
          }
        }
      }
    }
    *(undefined1 *)((long)context + 0x70) = 0;
    *(uint *)((long)context + 0x4c) = (uint)(iVar4 != 0) * 8 + 3;
  }
  iVar4 = BUFFER_append_build(*(BUFFER_HANDLE *)((long)context + 0x68),buffer,len);
  if (iVar4 != 0) {
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 != (LOGGER_LOG)0x0) {
      (*p_Var8)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                ,"on_bytes_received",0x211,1,"Failure appending bytes to buffer.");
    }
    *(undefined4 *)((long)context + 0x4c) = 0xb;
  }
  if (*(int *)((long)context + 0x4c) == 3) {
    puVar10 = BUFFER_u_char(*(BUFFER_HANDLE *)((long)context + 0x68));
    sVar11 = BUFFER_length(*(BUFFER_HANDLE *)((long)context + 0x68));
    local_68._0_2_ = 0;
    local_68._2_1_ = '\0';
    local_68._3_1_ = 0;
    iVar4 = 0;
    if (sVar11 == 0) {
      sVar29 = 0;
    }
    else {
      puVar17 = (uchar *)0x0;
      sVar29 = 1;
      do {
        local_68._3_1_ = 0;
        if (puVar10[sVar29 - 1] == ' ') {
          if (iVar4 == 1) {
            local_68._2_1_ = puVar17[2];
            local_68._0_2_ = *(undefined2 *)puVar17;
          }
          else {
            puVar17 = puVar10 + sVar29;
          }
          iVar4 = iVar4 + 1;
        }
        else if (puVar10[sVar29 - 1] == '\n') {
          lVar12 = atol((char *)&local_68);
          *(int *)((long)context + 0x48) = (int)lVar12;
          iVar4 = 1;
          goto LAB_001043be;
        }
        local_68._3_1_ = 0;
        bVar30 = sVar29 != sVar11;
        sVar29 = sVar29 + 1;
      } while (bVar30);
      sVar29 = 0;
      iVar4 = 0;
    }
LAB_001043be:
    if (((char)iVar4 != '\0') && (0 < *(int *)((long)context + 0x48))) {
      iVar4 = BUFFER_shrink(*(BUFFER_HANDLE *)((long)context + 0x68),sVar29,false);
      if (iVar4 == 0) {
        uVar15 = 4;
      }
      else {
        p_Var8 = xlogging_get_log_function();
        uVar15 = 0xb;
        if (p_Var8 != (LOGGER_LOG)0x0) {
          (*p_Var8)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                    ,"on_bytes_received",0x220,1,"Failure appending bytes to buffer.");
        }
      }
      *(undefined4 *)((long)context + 0x4c) = uVar15;
    }
  }
  if (*(int *)((long)context + 0x4c) == 4) {
    puVar10 = BUFFER_u_char(*(BUFFER_HANDLE *)((long)context + 0x68));
    sVar11 = BUFFER_length(*(BUFFER_HANDLE *)((long)context + 0x68));
    if (sVar11 == 0) {
      uVar25 = 0;
      pcVar22 = (char *)0x0;
      bVar30 = false;
    }
    else {
      local_38 = *(HTTP_HEADERS_HANDLE *)((long)context + 0x50);
      bVar14 = true;
      local_74 = 0xb2;
      local_58 = 0;
      uVar25 = 0;
      bVar30 = false;
      uVar19 = 0;
      pcVar22 = (char *)0x0;
      puVar27 = puVar10;
      puVar17 = puVar10;
      local_60 = sVar11;
      local_50 = puVar10;
      do {
        puVar24 = puVar27 + uVar25;
        uVar1 = puVar27[uVar25];
        if (uVar1 == '\n') {
          if (bVar30) {
            uVar25 = uVar25 + 1;
            bVar30 = true;
            goto LAB_001047fa;
          }
          puVar17 = puVar24 + 1;
          bVar30 = true;
          uVar19 = 0;
        }
        else if (uVar1 == '\r') {
          if (pcVar22 == (char *)0x0) {
            pcVar22 = (char *)0x0;
          }
          else {
            puVar27 = puVar17 + -1;
            puVar17 = puVar27;
            do {
              puVar27 = puVar27 + 1;
              puVar28 = puVar17 + 1;
              puVar17 = puVar17 + 1;
            } while (*puVar28 == ' ');
            sVar16 = (long)puVar10 - (long)puVar27;
            if (puVar24 < puVar17) {
              sVar16 = 0xffffffffffffffff;
            }
            pcVar23 = (char *)(sVar16 + 1);
            if (pcVar23 == (char *)0x0) {
              pcVar23 = (char *)0xffffffffffffffff;
            }
            local_44 = (uint)uVar19;
            if ((pcVar23 == (char *)0xffffffffffffffff) ||
               (value = (char *)malloc((size_t)pcVar23), value == (char *)0x0)) {
              p_Var8 = xlogging_get_log_function();
              local_74 = 0xf5;
              if (p_Var8 != (LOGGER_LOG)0x0) {
                (*p_Var8)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                          ,"process_header_line",0xf4,1,"Cannot malloc headerValue, size:%zu",
                          pcVar23);
                in_stack_ffffffffffffff58 = pcVar23;
              }
              bVar14 = false;
              value = (char *)0x0;
            }
            else {
              memcpy(value,puVar17,sVar16);
              value[sVar16] = '\0';
              HVar5 = HTTPHeaders_AddHeaderNameValuePair(local_38,pcVar22,value);
              if (HVar5 == HTTP_HEADERS_OK) {
                iVar4 = strcmp(pcVar22,"content-length");
                if (iVar4 == 0) {
                  *(undefined1 *)((long)context + 0x70) = 0;
                  lVar12 = atol(value);
                  *(long *)((long)context + 0x60) = lVar12;
                  local_58 = uVar25;
                }
                else {
                  iVar4 = strcmp(pcVar22,"transfer-encoding");
                  local_58 = uVar25;
                  if (iVar4 == 0) {
                    *(undefined1 *)((long)context + 0x70) = 1;
                    *(undefined8 *)((long)context + 0x60) = 0;
                  }
                }
              }
              else {
                local_74 = 0x100;
                bVar14 = false;
              }
            }
            free(pcVar22);
            free(value);
            pcVar22 = (char *)0x0;
            uVar19 = (ulong)local_44;
            sVar11 = local_60;
            puVar27 = local_50;
          }
        }
        else if ((uVar1 == ':') && ((uVar19 & 1) == 0)) {
          sVar16 = (long)puVar24 - (long)puVar17;
          if (sVar16 == 0) {
            p_Var8 = xlogging_get_log_function();
            local_74 = 0xc4;
            uVar20 = (undefined7)(uVar19 >> 8);
            if (p_Var8 != (LOGGER_LOG)0x0) {
              pcVar23 = 
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c";
              (*p_Var8)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                        ,"process_header_line",0xc3,1,"Invalid header name with zero length.");
              uVar20 = (undefined7)((ulong)pcVar23 >> 8);
            }
          }
          else {
            if (pcVar22 != (char *)0x0) {
              free(pcVar22);
            }
            pcVar23 = (char *)(sVar16 + 1);
            if (pcVar23 == (char *)0x0) {
              pcVar23 = (char *)0xffffffffffffffff;
            }
            if ((pcVar23 != (char *)0xffffffffffffffff) &&
               (pcVar22 = (char *)malloc((size_t)pcVar23), pcVar22 != (char *)0x0)) {
              memcpy(pcVar22,puVar17,sVar16);
              pcVar22[sVar16] = '\0';
              pp_Var13 = __ctype_tolower_loc();
              lVar12 = 0;
              do {
                p_Var3 = *pp_Var13;
                pcVar22[lVar12] = (char)p_Var3[pcVar22[lVar12]];
                lVar12 = lVar12 + 1;
              } while (((long)puVar10 - (long)puVar17) + (ulong)((long)puVar10 - (long)puVar17 == 0)
                       != lVar12);
              puVar17 = puVar24 + 1;
              uVar19 = CONCAT71((int7)((ulong)p_Var3 >> 8),1);
              bVar30 = false;
              sVar11 = local_60;
              puVar27 = local_50;
              goto LAB_001047c9;
            }
            p_Var8 = xlogging_get_log_function();
            local_74 = 0xd3;
            uVar20 = (undefined7)(uVar19 >> 8);
            if (p_Var8 != (LOGGER_LOG)0x0) {
              pcVar22 = 
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c";
              (*p_Var8)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                        ,"process_header_line",0xd2,1,"Cannot malloc headerKey, size:%zu",pcVar23);
              uVar20 = (undefined7)((ulong)pcVar22 >> 8);
              in_stack_ffffffffffffff58 = pcVar23;
            }
            pcVar22 = (char *)0x0;
            puVar27 = local_50;
          }
          bVar14 = false;
          uVar19 = CONCAT71(uVar20,1);
          sVar11 = local_60;
        }
        else {
          bVar30 = false;
        }
LAB_001047c9:
        uVar25 = uVar25 + 1;
      } while ((uVar25 < sVar11) && (puVar10 = puVar10 + 1, bVar14));
      bVar30 = local_74 == 0;
      uVar25 = local_58;
    }
LAB_001047fa:
    if (pcVar22 != (char *)0x0) {
      free(pcVar22);
    }
    if (bVar30) {
      uVar6 = 5;
      if (*(long *)((long)context + 0x60) == 0) {
        uVar6 = *(byte *)((long)context + 0x70) ^ 7;
      }
      *(uint *)((long)context + 0x4c) = uVar6;
    }
    if ((uVar25 != 0) &&
       (iVar4 = BUFFER_shrink(*(BUFFER_HANDLE *)((long)context + 0x68),uVar25,false), iVar4 != 0)) {
      p_Var8 = xlogging_get_log_function();
      if (p_Var8 != (LOGGER_LOG)0x0) {
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                  ,"on_bytes_received",0x24a,1,"Failure appending bytes to buffer.");
      }
      *(undefined4 *)((long)context + 0x4c) = 0xb;
    }
  }
  if ((*(int *)((long)context + 0x4c) != 5) || (*(long *)((long)context + 0x60) == 0))
  goto LAB_0010494b;
  sVar11 = BUFFER_length(*(BUFFER_HANDLE *)((long)context + 0x68));
  uVar25 = *(ulong *)((long)context + 0x60);
  if (uVar25 == sVar11 || uVar25 == sVar11 - 4) {
    if (*(BUFFER_HANDLE *)((long)context + 0x58) != (BUFFER_HANDLE)0x0) {
      BUFFER_delete(*(BUFFER_HANDLE *)((long)context + 0x58));
    }
    pBVar9 = BUFFER_clone(*(BUFFER_HANDLE *)((long)context + 0x68));
    *(BUFFER_HANDLE *)((long)context + 0x58) = pBVar9;
    uVar15 = 7;
    if (pBVar9 == (BUFFER_HANDLE)0x0) {
      p_Var8 = xlogging_get_log_function();
      uVar15 = 0xb;
      if (p_Var8 != (LOGGER_LOG)0x0) {
        pcVar22 = "Failure cloning BUFFER.";
        iVar4 = 0x25e;
LAB_00104935:
        uVar15 = 0xb;
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                  ,"on_bytes_received",iVar4,1,pcVar22);
      }
    }
  }
  else {
    if (sVar11 <= uVar25) goto LAB_0010494b;
    p_Var8 = xlogging_get_log_function();
    uVar15 = 0xb;
    if (p_Var8 != (LOGGER_LOG)0x0) {
      pcVar22 = "Failure bytes encountered is greater then body length.";
      iVar4 = 0x268;
      goto LAB_00104935;
    }
  }
  *(undefined4 *)((long)context + 0x4c) = uVar15;
LAB_0010494b:
  if (*(int *)((long)context + 0x4c) == 6) {
    puVar10 = BUFFER_u_char(*(BUFFER_HANDLE *)((long)context + 0x68));
    sVar11 = BUFFER_length(*(BUFFER_HANDLE *)((long)context + 0x68));
    if (0 < (long)sVar11) {
      puVar17 = puVar10 + sVar11;
      puVar27 = puVar10;
      puVar24 = puVar10;
      puVar28 = puVar10;
      do {
        if (*puVar28 == '\n') {
          if (puVar10 == puVar24) {
            iVar4 = 0;
          }
          else {
            lVar12 = 0;
            iVar4 = 0;
            do {
              bVar2 = puVar24[lVar12];
              if (bVar2 == 0x3b) break;
              if ((byte)(bVar2 - 0x30) < 10) {
                iVar18 = bVar2 - 0x30;
              }
              else if ((byte)(bVar2 + 0xbf) < 6) {
                iVar18 = bVar2 - 0x37;
              }
              else {
                iVar18 = bVar2 - 0x57;
                if (5 < (byte)(bVar2 + 0x9f)) {
                  iVar18 = 0;
                }
              }
              iVar21 = iVar4 << 4;
              if (lVar12 == 0) {
                iVar21 = iVar4;
              }
              iVar4 = iVar21 + iVar18;
              lVar12 = lVar12 + 1;
            } while ((long)puVar10 - (long)puVar24 != lVar12);
          }
          if (iVar4 == 0) {
            *(uint *)((long)context + 0x4c) =
                 (uint)((uchar *)0xfffffffffffffffa < puVar28 + (-(long)puVar27 - sVar11)) * 3 + 4;
LAB_00104ab0:
            bVar30 = false;
            puVar26 = puVar28;
          }
          else {
            uVar25 = (long)iVar4 + 2;
            if ((ulong)((long)(puVar27 + sVar11) - (long)puVar28) <= uVar25) goto LAB_00104ab0;
            puVar26 = puVar28 + 1;
            iVar4 = BUFFER_append_build(*(BUFFER_HANDLE *)((long)context + 0x58),puVar26,(long)iVar4
                                       );
            if (iVar4 == 0) {
              puVar28 = puVar26 + uVar25;
              if (puVar17 < puVar28) {
                p_Var8 = xlogging_get_log_function();
                if (p_Var8 != (LOGGER_LOG)0x0) {
                  (*p_Var8)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                            ,"on_bytes_received",0x2a2,1,"Invalid length specified.");
                }
                *(undefined4 *)((long)context + 0x4c) = 0xb;
LAB_00104afc:
                bVar30 = false;
              }
              else if (puVar28 == puVar17) {
                bVar30 = false;
                iVar4 = BUFFER_shrink(*(BUFFER_HANDLE *)((long)context + 0x68),sVar11,false);
                if (iVar4 != 0) {
                  p_Var8 = xlogging_get_log_function();
                  if (p_Var8 != (LOGGER_LOG)0x0) {
                    (*p_Var8)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                              ,"on_bytes_received",0x2aa,1,"Failure shrinking accural buffer.");
                  }
                  *(undefined4 *)((long)context + 0x4c) = 0xb;
                  goto LAB_00104afc;
                }
              }
              else {
                puVar26 = puVar28;
                if ((*puVar28 == '0') &&
                   (0xfffffffffffffffa < (ulong)((long)puVar28 - (long)(puVar27 + sVar11)))) {
                  *(undefined4 *)((long)context + 0x4c) = 7;
                  bVar30 = false;
                }
                else {
                  bVar30 = true;
                  puVar10 = puVar28;
                  puVar24 = puVar28;
                  if ((long)puVar28 - (long)puVar27 != 0) {
                    iVar4 = BUFFER_shrink(*(BUFFER_HANDLE *)((long)context + 0x68),
                                          (long)puVar28 - (long)puVar27,false);
                    if (iVar4 == 0) {
                      sVar11 = BUFFER_length(*(BUFFER_HANDLE *)((long)context + 0x68));
                      puVar27 = BUFFER_u_char(*(BUFFER_HANDLE *)((long)context + 0x68));
                      puVar10 = puVar27;
                      puVar24 = puVar27;
                      puVar26 = puVar27;
                    }
                    else {
                      p_Var8 = xlogging_get_log_function();
                      if (p_Var8 != (LOGGER_LOG)0x0) {
                        (*p_Var8)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                                  ,"on_bytes_received",0x2ca,1,"Failure shrinking accrual buffer.");
                      }
                      *(undefined4 *)((long)context + 0x4c) = 0xb;
                    }
                  }
                }
              }
            }
            else {
              p_Var8 = xlogging_get_log_function();
              if (p_Var8 != (LOGGER_LOG)0x0) {
                (*p_Var8)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                          ,"on_bytes_received",0x29a,1,"Failure building buffer for chunked data.");
              }
              *(undefined4 *)((long)context + 0x4c) = 0xb;
              bVar30 = true;
              puVar10 = puVar26;
              puVar24 = puVar26;
            }
          }
          if (!bVar30) break;
        }
        else {
          puVar26 = puVar28 + 1;
          puVar10 = puVar28;
        }
        puVar17 = puVar27 + sVar11;
        puVar28 = puVar26;
      } while (puVar26 < puVar17);
    }
  }
  if ((*(int *)((long)context + 0x4c) == 0xb) || (*(int *)((long)context + 0x4c) == 7)) {
    if (*(BUFFER_HANDLE *)((long)context + 0x58) == (BUFFER_HANDLE)0x0) {
      puVar10 = (uchar *)0x0;
      sVar11 = 0;
    }
    else {
      puVar10 = BUFFER_u_char(*(BUFFER_HANDLE *)((long)context + 0x58));
      sVar11 = BUFFER_length(*(BUFFER_HANDLE *)((long)context + 0x58));
    }
    iVar4 = *(int *)((long)context + 0x4c);
    if (*(char *)((long)context + 0x79) == '\x01') {
      p_Var8 = xlogging_get_log_function();
      if (p_Var8 != (LOGGER_LOG)0x0) {
        in_stack_ffffffffffffff58 =
             (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                              *(undefined4 *)((long)context + 0x48));
        (*p_Var8)(AZ_LOG_TRACE,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                  ,"on_bytes_received",0x2f4,1,"\r\nHTTP Status: %d\r\n",in_stack_ffffffffffffff58);
      }
      HVar5 = HTTPHeaders_GetHeaderCount(*(HTTP_HEADERS_HANDLE *)((long)context + 0x50),&local_68);
      uVar15 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
      if ((HVar5 == HTTP_HEADERS_RESULT_INVALID) &&
         (CONCAT44(local_68._4_4_,
                   CONCAT13(local_68._3_1_,CONCAT12(local_68._2_1_,(undefined2)local_68))) != 0)) {
        sVar29 = 0;
        do {
          HVar5 = HTTPHeaders_GetHeader
                            (*(HTTP_HEADERS_HANDLE *)((long)context + 0x50),sVar29,&local_40);
          if (HVar5 == HTTP_HEADERS_OK) {
            p_Var8 = xlogging_get_log_function();
            if (p_Var8 != (LOGGER_LOG)0x0) {
              in_stack_ffffffffffffff58 = local_40;
              (*p_Var8)(AZ_LOG_TRACE,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                        ,"on_bytes_received",0x2ff,1,"%s",local_40);
            }
            free(local_40);
          }
          uVar15 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
          sVar29 = sVar29 + 1;
        } while (sVar29 < CONCAT44(local_68._4_4_,
                                   CONCAT13(local_68._3_1_,
                                            CONCAT12(local_68._2_1_,(undefined2)local_68))));
      }
      if (((sVar11 != 0 & *(byte *)((long)context + 0x7a)) == 1) &&
         (p_Var8 = xlogging_get_log_function(), p_Var8 != (LOGGER_LOG)0x0)) {
        (*p_Var8)(AZ_LOG_TRACE,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                  ,"on_bytes_received",0x306,1,"\r\n%.*s\r\n",CONCAT44(uVar15,(int)sVar11),puVar10);
      }
    }
    (**(code **)((long)context + 0x38))
              (*(undefined8 *)((long)context + 0x40),(iVar4 == 0xb) * '\x04' + '\x01',puVar10,sVar11
               ,*(undefined4 *)((long)context + 0x48),*(undefined8 *)((long)context + 0x50));
    *(undefined4 *)((long)context + 0x4c) = 8;
  }
  if (*(int *)((long)context + 0x4c) == 8) {
    HTTPHeaders_Free(*(HTTP_HEADERS_HANDLE *)((long)context + 0x50));
    *(undefined8 *)((long)context + 0x50) = 0;
    BUFFER_delete(*(BUFFER_HANDLE *)((long)context + 0x58));
    *(undefined8 *)((long)context + 0x58) = 0;
    BUFFER_delete(*(BUFFER_HANDLE *)((long)context + 0x68));
    *(undefined8 *)((long)context + 0x68) = 0;
  }
  return;
}

Assistant:

static void on_bytes_received(void* context, const unsigned char* buffer, size_t len)
{
    HTTP_CLIENT_HANDLE_DATA* http_data = (HTTP_CLIENT_HANDLE_DATA*)context;

    if (http_data != NULL && buffer != NULL && len > 0 && http_data->recv_msg.recv_state != state_error)
    {
        if (http_data->recv_msg.recv_state == state_parse_complete)
        {
            // The callback is getting called during a new send.
            setup_init_recv_msg(&http_data->recv_msg);

        }

        if (http_data->recv_msg.recv_state == state_initial || http_data->recv_msg.recv_state == state_open)
        {
            if (initialize_received_data(http_data) != 0)
            {
                http_data->recv_msg.recv_state = state_error;
            }
            else
            {
                http_data->recv_msg.recv_state = state_process_status_line;
            }
        }

        // Put the data in the buffer
        if (BUFFER_append_build(http_data->recv_msg.accrual_buff, buffer, len) != 0)
        {
            /* Codes_SRS_UHTTP_07_048: [ If any error is encountered on_bytes_received shall set the state to error. ] */
            LogError("Failure appending bytes to buffer.");
            http_data->recv_msg.recv_state = state_error;
        }

        if (http_data->recv_msg.recv_state == state_process_status_line)
        {
            size_t index = 0;
            const unsigned char* stored_bytes = BUFFER_u_char(http_data->recv_msg.accrual_buff);
            size_t stored_len = BUFFER_length(http_data->recv_msg.accrual_buff);

            int lineComplete = process_status_code_line(stored_bytes, stored_len, &index, &http_data->recv_msg.status_code);
            if (lineComplete == 0 && http_data->recv_msg.status_code > 0)
            {
                if (BUFFER_shrink(http_data->recv_msg.accrual_buff, index, false) != 0)
                {
                    LogError("Failure appending bytes to buffer.");
                    http_data->recv_msg.recv_state = state_error;
                }
                else
                {
                    http_data->recv_msg.recv_state = state_process_headers;
                }
            }
        }

        if (http_data->recv_msg.recv_state == state_process_headers)
        {
            size_t index = 0;
            const unsigned char* stored_bytes = BUFFER_u_char(http_data->recv_msg.accrual_buff);
            size_t stored_len = BUFFER_length(http_data->recv_msg.accrual_buff);

            int headerComplete = process_header_line(stored_bytes, stored_len, &index, http_data->recv_msg.resp_header, &http_data->recv_msg.total_body_len, &http_data->recv_msg.chunked_reply);
            if (headerComplete == 0)
            {
                if (http_data->recv_msg.total_body_len == 0)
                {
                    if (http_data->recv_msg.chunked_reply)
                    {

                        /* Codes_SRS_UHTTP_07_054: [ If the http header does not include a content length then it indicates a chunk response. ] */
                        http_data->recv_msg.recv_state = state_process_chunked_body;
                    }
                    else
                    {
                        // Content len is 0 so we are finished with the body
                        http_data->recv_msg.recv_state = state_send_user_callback;
                    }
                }
                else
                {
                    http_data->recv_msg.recv_state = state_process_body;
                }
            }
            if (index > 0)
            {
                if (BUFFER_shrink(http_data->recv_msg.accrual_buff, index, false) != 0)
                {
                    LogError("Failure appending bytes to buffer.");
                    http_data->recv_msg.recv_state = state_error;
                }
            }
        }

        if (http_data->recv_msg.recv_state == state_process_body)
        {
            if (http_data->recv_msg.total_body_len != 0)
            {
                size_t stored_len = BUFFER_length(http_data->recv_msg.accrual_buff);

                if ((http_data->recv_msg.total_body_len == stored_len) || (http_data->recv_msg.total_body_len == (stored_len - HTTP_END_TOKEN_LEN)))
                {
                    if (http_data->recv_msg.msg_body != NULL)
                    {
                        BUFFER_delete(http_data->recv_msg.msg_body);
                    }
                    if ((http_data->recv_msg.msg_body = BUFFER_clone(http_data->recv_msg.accrual_buff)) == NULL)
                    {
                        LogError("Failure cloning BUFFER.");
                        http_data->recv_msg.recv_state = state_error;
                    }
                    else
                    {
                        http_data->recv_msg.recv_state = state_send_user_callback;
                    }
                }
                else if (stored_len > http_data->recv_msg.total_body_len)
                {
                    LogError("Failure bytes encountered is greater then body length.");
                    http_data->recv_msg.recv_state = state_error;
                }
            }
        }

        if (http_data->recv_msg.recv_state == state_process_chunked_body)
        {
            const unsigned char* iterator = BUFFER_u_char(http_data->recv_msg.accrual_buff);
            const unsigned char* initial_pos = iterator;
            const unsigned char* begin = iterator;
            const unsigned char* end = iterator;
            size_t accural_len = BUFFER_length(http_data->recv_msg.accrual_buff);

            /* Codes_SRS_UHTTP_07_059: [ on_bytes_received shall loop throught the stored data to find the /r/n separator. ] */
            while (iterator < (initial_pos + accural_len))
            {
                if (*iterator == '\r')
                {
                    // Don't need anything
                    end = iterator;
                    iterator++;
                }
                else if (*iterator == '\n')
                {
                    size_t data_length = 0;

                    /* Codes_SRS_UHTTP_07_055: [ on_bytes_received shall convert the hexs length supplied in the response to the data length of the chunked data. ] */
                    size_t hex_len = end - begin;
                    data_length = convert_char_to_hex(begin, hex_len);
                    if (data_length == 0)
                    {
                        if (accural_len - (iterator - initial_pos + 1) <= HTTP_END_TOKEN_LEN)
                        {
                            http_data->recv_msg.recv_state = state_send_user_callback;
                        }
                        else
                        {
                            // Need to continue parsing
                            http_data->recv_msg.recv_state = state_process_headers;
                        }
                        break;
                    }
                    else if ((data_length + HTTP_CRLF_LEN) < accural_len - (iterator - initial_pos))
                    {
                        /* Codes_SRS_UHTTP_07_056: [ After the response chunk is parsed it shall be placed in a BUFFER_HANDLE. ] */
                        iterator += 1;
                        if (BUFFER_append_build(http_data->recv_msg.msg_body, iterator, data_length) != 0)
                        {
                            /* Codes_SRS_UHTTP_07_048: [ If any error is encountered on_bytes_received shall set the stop processing the request. ] */
                            LogError("Failure building buffer for chunked data.");
                            http_data->recv_msg.recv_state = state_error;
                        }
                        else
                        {
                            /* Codes_SRS_UHTTP_07_060: [ if the data_length specified in the chunk is beyond the amount of data recieved, the parsing shall end and wait for more data. ] */
                            if (iterator + (data_length + HTTP_CRLF_LEN) > initial_pos + accural_len)
                            {
                                LogError("Invalid length specified.");
                                http_data->recv_msg.recv_state = state_error;
                                break;
                            }
                            else if (iterator + (data_length + HTTP_CRLF_LEN) == initial_pos + accural_len)
                            {
                                if (BUFFER_shrink(http_data->recv_msg.accrual_buff, accural_len, false) != 0)
                                {
                                    LogError("Failure shrinking accural buffer.");
                                    http_data->recv_msg.recv_state = state_error;
                                }
                                break;
                            }
                            else
                            {
                                // Move the iterator beyond the data we read and the /r/n
                                iterator += (data_length + HTTP_CRLF_LEN);
                            }

                            /* Codes_SRS_UHTTP_07_058: [ Once a chunk size value of 0 is encountered on_bytes_received shall call the on_request_callback with the http message ] */
                            if (*iterator == '0' && (accural_len - (iterator - initial_pos + 1) <= HTTP_END_TOKEN_LEN))
                            {
                                if (accural_len - (iterator - initial_pos + 1) <= HTTP_END_TOKEN_LEN)
                                {
                                    http_data->recv_msg.recv_state = state_send_user_callback;
                                }
                                else
                                {
                                    // Need to continue parsing
                                    http_data->recv_msg.recv_state = state_process_headers;
                                }
                                break;
                            }
                            else
                            {
                                size_t shrink_len = iterator - initial_pos;
                                if (shrink_len > 0)
                                {
                                    if (BUFFER_shrink(http_data->recv_msg.accrual_buff, shrink_len, false) != 0)
                                    {
                                        LogError("Failure shrinking accrual buffer.");
                                        http_data->recv_msg.recv_state = state_error;
                                    }
                                    else
                                    {
                                        accural_len = BUFFER_length(http_data->recv_msg.accrual_buff);
                                        initial_pos = iterator = BUFFER_u_char(http_data->recv_msg.accrual_buff);
                                    }
                                }
                            }
                        }
                        begin = end = iterator;
                    }
                    else
                    {
                        break;
                    }
                }
                else
                {
                    end = iterator;
                    iterator++;
                }
            }
        }

        if (http_data->recv_msg.recv_state == state_send_user_callback || http_data->recv_msg.recv_state == state_error)
        {
            const unsigned char* reply_data = NULL;
            size_t reply_len = 0;
            HTTP_CALLBACK_REASON http_reason = HTTP_CALLBACK_REASON_OK;
            if (http_data->recv_msg.msg_body != NULL)
            {
                reply_data = BUFFER_u_char(http_data->recv_msg.msg_body);
                reply_len = BUFFER_length(http_data->recv_msg.msg_body);
            }
            if (http_data->recv_msg.recv_state == state_error)
            {
                http_reason = HTTP_CALLBACK_REASON_PARSING_ERROR;
            }
            if (http_data->trace_on)
            {
                LOG(AZ_LOG_TRACE, LOG_LINE, "\r\nHTTP Status: %d\r\n", http_data->recv_msg.status_code);

                // Loop through headers
                size_t count;
                if (HTTPHeaders_GetHeaderCount(http_data->recv_msg.resp_header, &count) == 0)
                {
                    for (size_t index = 0; index < count; index++)
                    {
                        char* header;
                        if (HTTPHeaders_GetHeader(http_data->recv_msg.resp_header, index, &header) == HTTP_HEADERS_OK)
                        {
                            LOG(AZ_LOG_TRACE, LOG_LINE, "%s", header);
                            free(header);
                        }
                    }
                }
                if (http_data->trace_body && reply_len > 0)
                {
                    LOG(AZ_LOG_TRACE, LOG_LINE, "\r\n%.*s\r\n", (int)reply_len, reply_data);
                }
            }
            http_data->recv_msg.on_request_callback(http_data->recv_msg.user_ctx, http_reason, reply_data, reply_len, http_data->recv_msg.status_code, http_data->recv_msg.resp_header);
            http_data->recv_msg.recv_state = state_parse_complete;
        }

        if (http_data->recv_msg.recv_state == state_parse_complete)
        {
            HTTPHeaders_Free(http_data->recv_msg.resp_header);
            http_data->recv_msg.resp_header = NULL;
            BUFFER_delete(http_data->recv_msg.msg_body);
            http_data->recv_msg.msg_body = NULL;
            BUFFER_delete(http_data->recv_msg.accrual_buff);
            http_data->recv_msg.accrual_buff = NULL;
        }
    }
}